

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<data_structures::SymbolTableElement<int,_int>_> * __thiscall
data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::deleteAfterNode
          (LinkedList<data_structures::SymbolTableElement<int,_int>_> *this,
          ListNode<data_structures::SymbolTableElement<int,_int>_> *_previous)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *_current;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *_previous_local;
  LinkedList<data_structures::SymbolTableElement<int,_int>_> *this_local;
  
  pLVar1 = ListNode<data_structures::SymbolTableElement<int,_int>_>::next(_previous);
  ListNode<data_structures::SymbolTableElement<int,_int>_>::deleteAfter(_previous);
  if (pLVar1 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
    (*pLVar1->_vptr_ListNode[1])();
  }
  if (pLVar1 == this->_tail) {
    this->_tail = _previous;
  }
  this->_size = this->_size - 1;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::deleteAfterNode(ListNode<T>* _previous){
        ListNode<T>* _current = _previous->next();
        _previous->deleteAfter();
        delete _current;
        if (_current == _tail) {
            _tail = _previous;
        }
        _size--;
        return this;
    }